

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uxsel.c
# Opt level: O0

void select_result(int fd,int event)

{
  void *pvVar1;
  fd *fdstruct;
  int event_local;
  int fd_local;
  
  fdstruct._0_4_ = event;
  fdstruct._4_4_ = fd;
  pvVar1 = find234(fds,(void *)((long)&fdstruct + 4),uxsel_fd_findcmp);
  noise_ultralight(NOISE_SOURCE_IOID,(long)fdstruct._4_4_);
  if (pvVar1 != (void *)0x0) {
    (**(code **)((long)pvVar1 + 8))(fdstruct._4_4_,(int)fdstruct);
  }
  return;
}

Assistant:

void select_result(int fd, int event)
{
    struct fd *fdstruct = find234(fds, &fd, uxsel_fd_findcmp);

    noise_ultralight(NOISE_SOURCE_IOID, fd);

    /*
     * Apparently this can sometimes be NULL. Can't see how, but I
     * assume it means I need to ignore the event since it's on an
     * fd I've stopped being interested in. Sigh.
     */
    if (fdstruct)
        fdstruct->callback(fd, event);
}